

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O1

void __thiscall Restaurant::Restaurant(Restaurant *this,string *configFilePath)

{
  pointer *pppTVar1;
  int iVar2;
  pointer ppTVar3;
  pointer ppTVar4;
  iterator __position;
  pointer pcVar5;
  pointer pDVar6;
  pointer pDVar7;
  pointer ppBVar8;
  pointer pbVar9;
  pointer pbVar10;
  char cVar11;
  DishType d_type;
  istream *piVar12;
  long lVar13;
  int *piVar14;
  Table *pTVar15;
  Restaurant *pRVar16;
  undefined8 uVar17;
  long lVar18;
  pointer pbVar19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newDish;
  Table *t;
  string line;
  string delimeter;
  string token;
  Dish toBeAdd;
  ifstream myfile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_348;
  Table *local_330;
  char *local_328;
  undefined8 local_320;
  char local_318 [16];
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  vector<Table*,std::allocator<Table*>> *local_2e8;
  vector<Dish,_std::allocator<Dish>_> *local_2e0;
  undefined1 local_2d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  string *local_2b0;
  string local_2a8;
  undefined1 local_288 [24];
  BaseAction *local_270 [3];
  undefined1 local_258 [32];
  pointer local_238 [65];
  
  this->_vptr_Restaurant = (_func_int **)&PTR__Restaurant_00111d90;
  this->open = true;
  local_2e8 = (vector<Table*,std::allocator<Table*>> *)&this->tables;
  local_2e0 = &this->menu;
  local_2b0 = &this->newMsg;
  local_2b8 = &(this->newMsg).field_2;
  *(undefined8 *)&this->nextCustomerId = 0;
  *(undefined8 *)
   ((long)&(this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->menu).super__Vector_base<Dish,_std::allocator<Dish>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->menu).super__Vector_base<Dish,_std::allocator<Dish>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->menu).super__Vector_base<Dish,_std::allocator<Dish>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->newMsg)._M_dataplus._M_p = (pointer)local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"");
  std::ifstream::ifstream(local_238,(string *)configFilePath,_S_in);
  local_328 = local_318;
  local_320 = 0;
  local_318[0] = '\0';
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,",","");
  cVar11 = std::__basic_file<char>::is_open();
  if (cVar11 != '\0') {
    lVar18 = 0x7f;
    while( true ) {
      cVar11 = std::ios::widen((char)local_238[0][-3] + (char)(istream *)local_238);
      piVar12 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)local_238,(string *)&local_328,cVar11);
      if (((byte)piVar12[*(long *)(*(long *)piVar12 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::string::append((char *)&local_328);
      local_2d8._8_8_ = 0;
      local_2d8[0x10] = '\0';
      local_348.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_348.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_348.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2d8._0_8_ = (Restaurant *)(local_2d8 + 0x10);
      lVar13 = std::__cxx11::string::find((char *)&local_328,(ulong)local_308[0],0);
      while ((lVar13 != -1 && (*local_328 != '#'))) {
        ppTVar3 = (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        ppTVar4 = (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        std::__cxx11::string::substr((ulong)local_288,(ulong)&local_328);
        std::__cxx11::string::operator=((string *)local_2d8,(string *)local_288);
        if ((Restaurant *)local_288._0_8_ != (Restaurant *)(local_288 + 0x10)) {
          operator_delete((void *)local_288._0_8_);
        }
        pRVar16 = (Restaurant *)local_2d8._0_8_;
        if ((int)lVar18 == 0x7f) {
          piVar14 = __errno_location();
          iVar2 = *piVar14;
          *piVar14 = 0;
          lVar18 = strtol((char *)pRVar16,(char **)local_288,10);
          if ((Restaurant *)local_288._0_8_ != pRVar16) {
            if ((0xfffffffeffffffff < lVar18 - 0x80000000U) && (*piVar14 != 0x22)) {
              if (*piVar14 == 0) {
                *piVar14 = iVar2;
              }
              std::__cxx11::string::erase((ulong)&local_328,0);
              goto LAB_00109213;
            }
LAB_00109462:
            std::__throw_out_of_range("stoi");
          }
          std::__throw_invalid_argument("stoi");
LAB_0010947a:
          std::__throw_out_of_range("stoi");
LAB_00109486:
          uVar17 = std::__throw_invalid_argument("stoi");
          if (local_328 != local_318) {
            operator_delete(local_328);
          }
          std::ifstream::~ifstream(local_238);
          pcVar5 = (local_2b0->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar5 != local_2b8) {
            operator_delete(pcVar5);
          }
          ppBVar8 = (pRVar16->actionsLog).
                    super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (ppBVar8 != (pointer)0x0) {
            operator_delete(ppBVar8);
          }
          std::vector<Dish,_std::allocator<Dish>_>::~vector(local_2e0);
          if (*(void **)local_2e8 != (void *)0x0) {
            operator_delete(*(void **)local_2e8);
          }
          _Unwind_Resume(uVar17);
        }
        if ((int)((ulong)((long)ppTVar3 - (long)ppTVar4) >> 3) < (int)lVar18) {
          pTVar15 = (Table *)operator_new(0x40);
          uVar17 = local_2d8._0_8_;
          pRVar16 = (Restaurant *)__errno_location();
          iVar2 = *(int *)&pRVar16->_vptr_Restaurant;
          *(int *)&pRVar16->_vptr_Restaurant = 0;
          lVar13 = strtol((char *)uVar17,(char **)local_288,10);
          if (local_288._0_8_ == uVar17) goto LAB_00109486;
          if ((0xfffffffeffffffff < lVar13 - 0x80000000U) &&
             (*(int *)&pRVar16->_vptr_Restaurant != 0x22)) {
            if (*(int *)&pRVar16->_vptr_Restaurant == 0) {
              *(int *)&pRVar16->_vptr_Restaurant = iVar2;
            }
            Table::Table(pTVar15,(int)lVar13);
            __position._M_current =
                 (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_330 = pTVar15;
            if (__position._M_current ==
                (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Table*,std::allocator<Table*>>::_M_realloc_insert<Table*const&>
                        (local_2e8,__position,&local_330);
            }
            else {
              *__position._M_current = pTVar15;
              pppTVar1 = &(this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
              *pppTVar1 = *pppTVar1 + 1;
            }
            std::__cxx11::string::erase((ulong)&local_328,0);
            goto LAB_00109213;
          }
          goto LAB_0010947a;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_348,(value_type *)local_2d8);
        std::__cxx11::string::erase((ulong)&local_328,0);
LAB_00109213:
        if ((long)local_348.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_348.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x60) {
          pcVar5 = local_348.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
          pRVar16 = (Restaurant *)local_258;
          local_258._0_8_ = local_258 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_258,pcVar5,
                     pcVar5 + local_348.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
          d_type = findMyType(pRVar16,(string *)local_258);
          if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
            operator_delete((void *)local_258._0_8_);
          }
          pDVar6 = (this->menu).super__Vector_base<Dish,_std::allocator<Dish>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pDVar7 = (this->menu).super__Vector_base<Dish,_std::allocator<Dish>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
          pcVar5 = ((local_348.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2a8,pcVar5,
                     pcVar5 + (local_348.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
          pTVar15 = (Table *)local_348.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
          piVar14 = __errno_location();
          iVar2 = *piVar14;
          *piVar14 = 0;
          lVar13 = strtol((char *)pTVar15,(char **)&local_330,10);
          if (local_330 != pTVar15) {
            if ((0xfffffffeffffffff < lVar13 - 0x80000000U) && (*piVar14 != 0x22)) {
              if (*piVar14 == 0) {
                *piVar14 = iVar2;
              }
              Dish::Dish((Dish *)local_288,
                         (int)((ulong)((long)pDVar6 - (long)pDVar7) >> 4) * -0x55555555,&local_2a8,
                         (int)lVar13,d_type);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
                operator_delete(local_2a8._M_dataplus._M_p);
              }
              std::vector<Dish,_std::allocator<Dish>_>::push_back(local_2e0,(Dish *)local_288);
              pbVar10 = local_348.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pbVar9 = local_348.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pbVar19 = local_348.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_348.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_348.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                do {
                  pcVar5 = (pbVar19->_M_dataplus)._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar5 != &pbVar19->field_2) {
                    operator_delete(pcVar5);
                  }
                  pbVar19 = pbVar19 + 1;
                } while (pbVar19 != pbVar10);
                local_348.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = pbVar9;
              }
              if ((BaseAction **)local_288._8_8_ != local_270) {
                operator_delete((void *)local_288._8_8_);
              }
              goto LAB_001093a5;
            }
            std::__throw_out_of_range("stoi");
          }
          std::__throw_invalid_argument("stoi");
          pRVar16 = this;
          goto LAB_00109462;
        }
LAB_001093a5:
        lVar13 = std::__cxx11::string::find((char *)&local_328,(ulong)local_308[0],0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_348);
      if ((Restaurant *)local_2d8._0_8_ != (Restaurant *)(local_2d8 + 0x10)) {
        operator_delete((void *)local_2d8._0_8_);
      }
    }
  }
  if (local_308[0] != local_2f8) {
    operator_delete(local_308[0]);
  }
  if (local_328 != local_318) {
    operator_delete(local_328);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

Restaurant::Restaurant(const std::string &configFilePath) : open(true), nextCustomerId(0), tables(), menu(), actionsLog(), newMsg("")
{
    std::ifstream myfile(configFilePath);
    std::string line;
    std::string delimeter = ",";
    int numOfTables = INT8_MAX;

    if(myfile.is_open())
    {
        while (getline(myfile, line))
        {
            line  += ",";
            size_t pos = 0;
            std::string token;
            std::vector<std::string> newDish;
            while ((pos = line.find(delimeter)) != std::string::npos && line[0] != '#')
            {
                int tablesSize = tables.size();

                token = line.substr(0, pos);
                if(numOfTables == INT8_MAX)
                {
                    numOfTables = std::stoi(token);
                    line.erase(0, pos + delimeter.length());
                }
                else if(tablesSize < numOfTables)
                {
                    auto *t = new Table(std::stoi(token));
                    tables.push_back(t);
                    line.erase(0, pos + delimeter.length());
                }
                else
                {

                    newDish.push_back(token);
                    line.erase(0, pos + delimeter.length());
                }
                if(newDish.size() == 3)
                {
                    DishType menuDish = findMyType(newDish[1]);
                    Dish toBeAdd(static_cast<int>(menu.size()), newDish[0], std::stoi(newDish[2]), menuDish);
                    menu.push_back(toBeAdd);
                    newDish.clear();
                }
            }
        }
    }
}